

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_aggsig_add_signatures_single
              (secp256k1_context *ctx,uchar *sig64,uchar **sigs,size_t num_sigs,
              secp256k1_pubkey *pubnonce_total)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  int overflow;
  secp256k1_scalar tmp;
  secp256k1_gej pubnonce_total_j;
  secp256k1_ge noncesum_pt;
  secp256k1_ge final;
  int local_1c4;
  secp256k1_context *local_1c0;
  secp256k1_pubkey *local_1b8;
  uchar *local_1b0;
  secp256k1_scalar local_1a8;
  secp256k1_scalar local_188;
  secp256k1_gej local_168;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  if (num_sigs != 0) {
    sVar3 = 0;
    do {
      if (sigs[sVar3] == (uchar *)0x0) {
        secp256k1_aggsig_add_signatures_single_cold_1();
        return 0;
      }
      sVar3 = sVar3 + 1;
    } while (num_sigs != sVar3);
  }
  local_1a8.d[2] = 0;
  local_1a8.d[3] = 0;
  local_1a8.d[0] = 0;
  local_1a8.d[1] = 0;
  local_1c0 = ctx;
  local_1b8 = pubnonce_total;
  local_1b0 = sig64;
  if (num_sigs != 0) {
    sVar3 = 0;
    do {
      secp256k1_scalar_set_b32(&local_188,sigs[sVar3] + 0x20,&local_1c4);
      if (local_1c4 != 0) {
        return 0;
      }
      secp256k1_scalar_add(&local_1a8,&local_1a8,&local_188);
      sVar3 = sVar3 + 1;
    } while (num_sigs != sVar3);
  }
  local_168.infinity = 1;
  local_168.x.n[0] = 0;
  local_168.x.n[1] = 0;
  local_168.x.n[2] = 0;
  local_168.x.n[3] = 0;
  local_168.x.n[4] = 0;
  local_168.y.n[0] = 0;
  local_168.y.n[1] = 0;
  local_168.y.n[2] = 0;
  local_168.y.n[3] = 0;
  local_168.y.n[4] = 0;
  local_168.z.n[0] = 0;
  local_168.z.n[1] = 0;
  local_168.z.n[2] = 0;
  local_168.z.n[3] = 0;
  local_168.z.n[4] = 0;
  secp256k1_pubkey_load(local_1c0,&local_e0,local_1b8);
  secp256k1_gej_add_ge(&local_168,&local_168,&local_e0);
  iVar2 = secp256k1_gej_has_quad_y_var(&local_168);
  if (iVar2 == 0) {
    secp256k1_gej_neg(&local_168,&local_168);
  }
  secp256k1_ge_set_gej(&local_88,&local_168);
  secp256k1_fe_normalize_var(&local_88.x);
  puVar1 = local_1b0;
  secp256k1_fe_get_b32(local_1b0,&local_88.x);
  secp256k1_scalar_get_b32(puVar1 + 0x20,&local_1a8);
  return 1;
}

Assistant:

int secp256k1_aggsig_add_signatures_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char** sigs,
    size_t num_sigs,
    const secp256k1_pubkey* pubnonce_total) {

    secp256k1_scalar s;
    secp256k1_ge final;
    secp256k1_scalar tmp;
    secp256k1_ge noncesum_pt;
    secp256k1_gej pubnonce_total_j;
    size_t i;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(sigs != NULL);
    for (i=0;i<num_sigs;i++) ARG_CHECK(sigs[i] != NULL);
    ARG_CHECK(pubnonce_total != NULL);
    (void) ctx;

    /* Add signature portions together */
    secp256k1_scalar_set_int(&s, 0);
    for (i = 0; i < num_sigs; i++){
        secp256k1_scalar_set_b32(&tmp, sigs[i] + 32, &overflow);
        if (overflow) {
            return 0;
        }
        secp256k1_scalar_add(&s, &s, &tmp);
    }

    /* nonces should already be totalled */
    secp256k1_gej_set_infinity(&pubnonce_total_j);
    secp256k1_pubkey_load(ctx, &noncesum_pt, pubnonce_total);
    secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &noncesum_pt);
    if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
        secp256k1_gej_neg(&pubnonce_total_j, &pubnonce_total_j);
    }

    secp256k1_ge_set_gej(&final, &pubnonce_total_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &s);
    return 1;
}